

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngtest.c
# Opt level: O0

void pngtest_warning(png_structp png_ptr,png_const_charp message)

{
  long *plVar1;
  pngtest_error_parameters *test;
  char *name;
  png_const_charp message_local;
  png_structp png_ptr_local;
  
  test = (pngtest_error_parameters *)anon_var_dwarf_cd5;
  plVar1 = (long *)png_get_error_ptr(png_ptr);
  warning_count = warning_count + 1;
  if ((plVar1 != (long *)0x0) && (*plVar1 != 0)) {
    test = (pngtest_error_parameters *)*plVar1;
  }
  fprintf(_stdout,"\n%s: libpng warning: %s\n",test,message);
  return;
}

Assistant:

static void PNGCBAPI
pngtest_warning(png_structp png_ptr, png_const_charp message)
{
   const char *name = "UNKNOWN (ERROR!)";
   pngtest_error_parameters *test =
      (pngtest_error_parameters*)png_get_error_ptr(png_ptr);

   ++warning_count;

   if (test != NULL && test->file_name != NULL)
      name = test->file_name;

   fprintf(STDERR, "\n%s: libpng warning: %s\n", name, message);
}